

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O3

vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_> *
__thiscall
tonk::SDKConnectionList<MyClientConnection>::GetList
          (vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
           *__return_storage_ptr__,SDKConnectionList<MyClientConnection> *this)

{
  undefined8 *puVar1;
  pointer psVar2;
  long lVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  allocator_type local_29;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 == 0) {
    uVar8 = (long)(this->ConnectionList).
                  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ConnectionList).
                  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)uVar8 >> 4;
    std::
    vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
    ::vector(__return_storage_ptr__,uVar10 & 0xffffffff,&local_29);
    if ((int)(uVar8 >> 4) != 0) {
      uVar10 = uVar10 & 0xffffffff;
      lVar9 = 0;
      do {
        psVar2 = (this->ConnectionList).
                 super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)
                 ((long)&(psVar2->
                         super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar9);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        lVar3 = *(long *)((long)&(psVar2->
                                 super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_refcount._M_pi + lVar9);
        if (lVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          }
        }
        psVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar4->
                           super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi + lVar9);
        puVar1 = (undefined8 *)
                 ((long)&(psVar4->super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar9);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        lVar9 = lVar9 + 0x10;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

std::vector< std::shared_ptr<T> > GetList()
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);

        const unsigned count = static_cast<unsigned>(ConnectionList.size());
        std::vector< std::shared_ptr<T> > result(count);

        for (unsigned i = 0; i < count; ++i)
            result[i] = std::static_pointer_cast<T, SDKConnection>(ConnectionList[i]);

        return result;
    }